

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbitrary_utility.h
# Opt level: O2

tuple<int,_float> __thiscall
testinator::Arbitrary<std::tuple<int,_float>_>::generate
          (Arbitrary<std::tuple<int,_float>_> *this,size_t n,unsigned_long randomSeed)

{
  int iVar1;
  result_type randomSeed_00;
  
  randomSeed_00 = anon_unknown_6::nextRandom(randomSeed);
  iVar1 = detail::Arbitrary_Arithmetic<int>::generate(n,randomSeed);
  Arbitrary<std::tuple<float>_>::generate((Arbitrary<std::tuple<float>_> *)this,n,randomSeed_00);
  *(int *)(this + 4) = iVar1;
  return (tuple<int,_float>)(_Tuple_impl<0UL,_int,_float>)this;
}

Assistant:

static std::tuple<Ts...> generate(std::size_t n, unsigned long int randomSeed)
    {
      auto r1 = randomSeed;
      auto r2 = nextRandom(r1);

      using H = std::tuple_element_t<0, std::tuple<Ts...>>;
      using T = decltype(tuple_tail(std::declval<std::tuple<Ts...>>()));
      return tuple_cons(Arbitrary<H>::generate(n, r1),
                        Arbitrary<T>::generate(n, r2));
    }